

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_rawgeti(lua_State *L,int idx,lua_Integer n)

{
  StkId pSVar1;
  long lVar2;
  lu_byte lVar3;
  TValue *pTVar4;
  TValue *io1;
  
  pTVar4 = index2value(L,idx);
  pTVar4 = luaH_getint((Table *)(pTVar4->value_).gc,n);
  pSVar1 = (L->top).p;
  if ((pTVar4->tt_ & 0xf) == 0) {
    lVar3 = '\0';
  }
  else {
    (pSVar1->val).value_ = pTVar4->value_;
    lVar3 = pTVar4->tt_;
  }
  (pSVar1->val).tt_ = lVar3;
  lVar2 = (L->top).offset;
  (L->top).p = (StkId)(lVar2 + 0x10);
  return *(byte *)(lVar2 + 8) & 0xf;
}

Assistant:

LUA_API int lua_rawgeti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lua_lock(L);
  t = gettable(L, idx);
  return finishrawget(L, luaH_getint(t, n));
}